

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

int __thiscall
nonstd::any_lite::any::holder<(anonymous_namespace)::InitList>::clone
          (holder<(anonymous_namespace)::InitList> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = &PTR__holder_00169b18;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(puVar2 + 1),&(this->held).vec);
  *(char *)(puVar2 + 4) = (this->held).c;
  iVar1 = (this->held).s.value.value;
  *(undefined8 *)((long)puVar2 + 0x24) = 0x300000003;
  *(int *)((long)puVar2 + 0x2c) = iVar1;
  return (int)puVar2;
}

Assistant:

virtual placeholder * clone() const any_override
        {
            return new holder( held );
        }